

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_context.h
# Opt level: O2

void __thiscall
mocker::ir::BuilderContext::
emplaceInst<mocker::ir::Call,char_const*,std::shared_ptr<mocker::ir::Addr>&>
          (BuilderContext *this,char **args,shared_ptr<mocker::ir::Addr> *args_1)

{
  shared_ptr<mocker::ir::Call> inst;
  shared_ptr<mocker::ir::IRInst> local_38;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  std::make_shared<mocker::ir::Call,char_const*,std::shared_ptr<mocker::ir::Addr>&>
            ((char **)&local_28,(shared_ptr<mocker::ir::Addr> *)args);
  local_38.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_28;
  local_38.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_20._M_pi;
  local_28 = (element_type *)0x0;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  appendInst(this,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_20);
  return;
}

Assistant:

void emplaceInst(Args &&... args) {
    auto inst = std::make_shared<InstType>(std::forward<Args>(args)...);
    appendInst(std::move(inst));
  }